

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# golombrice.h
# Opt level: O1

uint64_t GolombRiceDecode<SpanReader>(BitStreamReader<SpanReader> *bitreader,uint8_t P)

{
  long lVar1;
  uint64_t uVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = -1;
  do {
    uVar2 = BitStreamReader<SpanReader>::Read(bitreader,1);
    lVar3 = lVar3 + 1;
  } while (uVar2 == 1);
  uVar2 = BitStreamReader<SpanReader>::Read(bitreader,(uint)P);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2 + (lVar3 << (P & 0x3f));
  }
  __stack_chk_fail();
}

Assistant:

uint64_t GolombRiceDecode(BitStreamReader<IStream>& bitreader, uint8_t P)
{
    // Read unary-encoded quotient: q 1's followed by one 0.
    uint64_t q = 0;
    while (bitreader.Read(1) == 1) {
        ++q;
    }

    uint64_t r = bitreader.Read(P);

    return (q << P) + r;
}